

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refine_peaks.cpp
# Opt level: O3

void trt_pose::parse::refine_peaks_out_hw
               (float *refined_peaks,int *counts,int *peaks,float *cmap,int H,int W,int M,
               int window_size)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  
  iVar2 = *counts;
  if (0 < (long)iVar2) {
    iVar8 = window_size / 2;
    auVar13._0_4_ = (float)H;
    auVar13._4_4_ = (float)W;
    auVar13._8_8_ = 0;
    lVar5 = 0;
    do {
      (refined_peaks + lVar5 * 2)[0] = 0.0;
      (refined_peaks + lVar5 * 2)[1] = 0.0;
      iVar3 = peaks[lVar5 * 2];
      iVar11 = iVar3 - iVar8;
      if (iVar3 + iVar8 < iVar11) {
        auVar15 = ZEXT816(0);
        fVar17 = 0.0;
      }
      else {
        iVar4 = peaks[lVar5 * 2 + 1];
        auVar15 = ZEXT816(0);
        fVar17 = 0.0;
        do {
          if (iVar4 - iVar8 <= iVar4 + iVar8) {
            iVar10 = (H * 2 + -2) - iVar11;
            if (iVar11 < H) {
              iVar10 = iVar11;
            }
            if (iVar11 < 0) {
              iVar10 = -iVar11;
            }
            auVar14 = auVar15;
            iVar9 = iVar8 - iVar4;
            iVar7 = iVar8 * 2 + 1;
            iVar6 = iVar4 - iVar8;
            do {
              iVar12 = W * 2 + -2 + iVar9;
              if (iVar6 < W) {
                iVar12 = iVar6;
              }
              if (iVar6 < 0) {
                iVar12 = iVar9;
              }
              fVar1 = cmap[iVar12 + iVar10 * W];
              fVar17 = fVar17 + fVar1;
              auVar15._0_8_ =
                   CONCAT44(auVar14._4_4_ + (float)iVar6 * fVar1,
                            auVar14._0_4_ + (float)iVar11 * fVar1);
              auVar15._8_4_ = auVar14._8_4_ + fVar1 * 0.0;
              auVar15._12_4_ = auVar14._12_4_ + fVar1 * 0.0;
              *(undefined8 *)(refined_peaks + lVar5 * 2) = auVar15._0_8_;
              iVar6 = iVar6 + 1;
              iVar9 = iVar9 + -1;
              iVar7 = iVar7 + -1;
              auVar14 = auVar15;
            } while (iVar7 != 0);
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 != iVar3 + iVar8 + 1);
      }
      auVar14._4_4_ = fVar17;
      auVar14._0_4_ = fVar17;
      auVar14._8_8_ = 0;
      auVar15 = divps(auVar15,auVar14);
      auVar16._0_4_ = auVar15._0_4_ + 0.5;
      auVar16._4_4_ = auVar15._4_4_ + 0.5;
      auVar16._8_4_ = auVar15._8_4_ + 0.0;
      auVar16._12_4_ = auVar15._12_4_ + 0.0;
      auVar15 = divps(auVar16,auVar13);
      *(long *)(refined_peaks + lVar5 * 2) = auVar15._0_8_;
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar2);
  }
  return;
}

Assistant:

void refine_peaks_out_hw(float *refined_peaks, // Mx2
                         const int *counts,    // 1
                         const int *peaks,     // Mx2
                         const float *cmap,    // HxW
                         const int H, const int W, const int M,
                         const int window_size) {
  int count = *counts;
  int win = window_size / 2;

  for (int m = 0; m < count; m++) {
    float *refined_peak = &refined_peaks[m * 2];
    refined_peak[0] = 0.;
    refined_peak[1] = 0.;
    const int *peak = &peaks[m * 2];

    int i = peak[0];
    int j = peak[1];
    float weight_sum = 0.;

    for (int ii = i - win; ii < i + win + 1; ii++) {
      int ii_idx = reflect(ii, 0, H);
      for (int jj = j - win; jj < j + win + 1; jj++) {
        int jj_idx = reflect(jj, 0, W);

        float weight = cmap[ii_idx * W + jj_idx];
        refined_peak[0] += weight * ii;
        refined_peak[1] += weight * jj;
        weight_sum += weight;
      }
    }

    refined_peak[0] /= weight_sum;
    refined_peak[1] /= weight_sum;
    refined_peak[0] += 0.5; // center pixel
    refined_peak[1] += 0.5; // center pixel
    refined_peak[0] /= H;   // normalize coordinates
    refined_peak[1] /= W;   // normalize coordinates
  }
}